

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZManVector<double,_3>,_4>::Resize
          (TPZManVector<TPZManVector<double,_3>,_4> *this,int64_t newsize,
          TPZManVector<double,_3> *object)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  TPZManVector<double,_3> *pTVar8;
  TPZManVector<double,_3> *pTVar9;
  double dVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar6 = (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
  if (newsize != lVar6) {
    lVar4 = (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc;
    if (lVar4 < newsize) {
      if (newsize < 5) {
        if ((this->super_TPZVec<TPZManVector<double,_3>_>).fNElements < 1) {
          lVar6 = 0;
        }
        else {
          lVar4 = 0;
          lVar6 = 0;
          do {
            TPZManVector<double,_3>::operator=
                      ((TPZManVector<double,_3> *)(&this->field_0x20 + lVar4),
                       (TPZManVector<double,_3> *)
                       ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                       lVar4 + -0x20));
            lVar6 = lVar6 + 1;
            lVar4 = lVar4 + 0x38;
          } while (lVar6 < (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements);
        }
        lVar4 = newsize - lVar6;
        if (lVar4 != 0 && lVar6 <= newsize) {
          pTVar8 = (TPZManVector<double,_3> *)(&this->field_0x20 + lVar6 * 0x38);
          do {
            TPZManVector<double,_3>::operator=(pTVar8,object);
            pTVar8 = pTVar8 + 1;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        pTVar8 = (this->super_TPZVec<TPZManVector<double,_3>_>).fStore;
        if (pTVar8 != (TPZManVector<double,_3> *)0x0 &&
            pTVar8 != (TPZManVector<double,_3> *)&this->field_0x20) {
          dVar10 = pTVar8[-1].fExtAlloc[2];
          if (dVar10 != 0.0) {
            lVar6 = (long)dVar10 * 0x38;
            do {
              TPZManVector<double,_3>::~TPZManVector
                        ((TPZManVector<double,_3> *)((long)pTVar8[-1].fExtAlloc + lVar6 + -0x20));
              lVar6 = lVar6 + -0x38;
            } while (lVar6 != 0);
          }
          operator_delete__(pTVar8[-1].fExtAlloc + 2,(long)dVar10 * 0x38 + 8);
        }
        (this->super_TPZVec<TPZManVector<double,_3>_>).fStore =
             (TPZManVector<double,_3> *)&this->field_0x20;
        (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
        (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = 4;
      }
      else {
        dVar10 = (double)lVar4 * 1.2;
        uVar7 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar7 = newsize;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar7;
        uVar2 = SUB168(auVar1 * ZEXT816(0x38),0);
        uVar5 = uVar2 + 8;
        if (0xfffffffffffffff7 < uVar2) {
          uVar5 = 0xffffffffffffffff;
        }
        if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        puVar3 = (ulong *)operator_new__(uVar5);
        *puVar3 = uVar7;
        pTVar8 = (TPZManVector<double,_3> *)(puVar3 + 1);
        if (uVar7 != 0) {
          lVar6 = 0;
          pTVar9 = pTVar8;
          do {
            TPZManVector<double,_3>::TPZManVector(pTVar9,0);
            lVar6 = lVar6 + -0x38;
            pTVar9 = pTVar9 + 1;
          } while (uVar7 * -0x38 - lVar6 != 0);
        }
        if ((this->super_TPZVec<TPZManVector<double,_3>_>).fNElements < 1) {
          lVar6 = 0;
        }
        else {
          lVar4 = 0;
          lVar6 = 0;
          do {
            TPZManVector<double,_3>::operator=
                      ((TPZManVector<double,_3> *)((long)pTVar8->fExtAlloc + lVar4 + -0x20),
                       (TPZManVector<double,_3> *)
                       ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                       lVar4 + -0x20));
            lVar6 = lVar6 + 1;
            lVar4 = lVar4 + 0x38;
          } while (lVar6 < (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements);
        }
        lVar4 = newsize - lVar6;
        if (lVar4 != 0 && lVar6 <= newsize) {
          pTVar9 = (TPZManVector<double,_3> *)(puVar3 + lVar6 * 7 + 1);
          do {
            TPZManVector<double,_3>::operator=(pTVar9,object);
            pTVar9 = pTVar9 + 1;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        pTVar9 = (this->super_TPZVec<TPZManVector<double,_3>_>).fStore;
        if (pTVar9 != (TPZManVector<double,_3> *)0x0 &&
            pTVar9 != (TPZManVector<double,_3> *)&this->field_0x20) {
          dVar10 = pTVar9[-1].fExtAlloc[2];
          if (dVar10 != 0.0) {
            lVar6 = (long)dVar10 * 0x38;
            do {
              TPZManVector<double,_3>::~TPZManVector
                        ((TPZManVector<double,_3> *)((long)pTVar9[-1].fExtAlloc + lVar6 + -0x20));
              lVar6 = lVar6 + -0x38;
            } while (lVar6 != 0);
          }
          operator_delete__(pTVar9[-1].fExtAlloc + 2,(long)dVar10 * 0x38 + 8);
        }
        (this->super_TPZVec<TPZManVector<double,_3>_>).fStore = pTVar8;
        (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
        (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = uVar7;
      }
    }
    else {
      lVar4 = newsize - lVar6;
      if (lVar4 != 0 && lVar6 <= newsize) {
        lVar6 = lVar6 * 0x38;
        do {
          TPZManVector<double,_3>::operator=
                    ((TPZManVector<double,_3> *)
                     ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                     lVar6 + -0x20),object);
          lVar6 = lVar6 + 0x38;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}